

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_index.c
# Opt level: O2

int vmcache_index_remove(VMEMcache *cache,cache_entry *entry)

{
  os_rwlock_t *m;
  int iVar1;
  critnib *c;
  void *pvVar2;
  long lVar3;
  int *piVar4;
  
  c = shard(cache->index,(entry->key).ksize,(char *)(entry + 1));
  m = &c->lock;
  util_rwlock_wrlock(m);
  pvVar2 = critnib_remove(c,entry);
  if (pvVar2 == (void *)0x0) {
    util_rwlock_unlock(m);
    out_err("/workspace/llm4binary/github/license_c_cmakelists/pmem[P]vmemcache/src/vmemcache_index.c"
            ,200,"vmcache_index_remove",
            "vmcache_index_remove: cannot find an element with the given key in the index");
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar1 = -1;
  }
  else {
    c->leaf_count = c->leaf_count - 1;
    c->evict_count = c->evict_count + 1;
    lVar3 = malloc_usable_size(entry);
    c->DRAM_usage = c->DRAM_usage - lVar3;
    vmemcache_entry_release(cache,entry);
    util_rwlock_unlock(m);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
vmcache_index_remove(VMEMcache *cache, struct cache_entry *entry)
{
	struct critnib *c = shard(cache->index, entry->key.ksize,
		entry->key.key);

	util_rwlock_wrlock(&c->lock);

	struct cache_entry *v = critnib_remove(c, entry);
	if (v == NULL) {
		util_rwlock_unlock(&c->lock);
		ERR(
			"vmcache_index_remove: cannot find an element with the given key in the index");
		errno = EINVAL;
		return -1;
	}

#ifdef STATS_ENABLED
	c->leaf_count--;
	c->evict_count++;
	c->DRAM_usage -= malloc_usable_size(entry);
#endif

	vmemcache_entry_release(cache, entry);

	util_rwlock_unlock(&c->lock);

	return 0;
}